

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

vector<char,_std::allocator<char>_> *
cnpy::operator+=(vector<char,_std::allocator<char>_> *lhs,unsigned_short rhs)

{
  undefined2 in_SI;
  vector<char,_std::allocator<char>_> *in_RDI;
  char val;
  size_t byte;
  value_type_conflict1 *__x;
  undefined6 in_stack_fffffffffffffff0;
  
  for (__x = (value_type_conflict1 *)0x0; __x < (value_type_conflict1 *)0x2; __x = __x + 1) {
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)CONCAT26(in_SI,in_stack_fffffffffffffff0),__x)
    ;
  }
  return in_RDI;
}

Assistant:

std::vector<char>& operator+=(std::vector<char>& lhs, const T rhs) {
        //write in little endian
        for(size_t byte = 0; byte < sizeof(T); byte++) {
            char val = *((char*)&rhs+byte); 
            lhs.push_back(val);
        }
        return lhs;
    }